

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UintTypes.cpp
# Opt level: O0

bool jbcoin::to_currency(Currency *currency,string *code)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  iterator __result;
  undefined1 local_90 [8];
  Serializer s;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  Blob codeBlob;
  string *code_local;
  Currency *currency_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    systemCurrencyCode_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((string *)code);
    if (iVar2 != 0) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 3) {
        std::allocator<unsigned_char>::allocator(&local_41);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,3,&local_41);
        std::allocator<unsigned_char>::~allocator(&local_41);
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        __result = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int(*)(int)>
                                (__first,__last,
                                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )__result._M_current,toupper);
        Serializer::Serializer((Serializer *)local_90,0x100);
        Serializer::addZeros((Serializer *)local_90,0xc);
        Serializer::addRaw((Serializer *)local_90,(Blob *)local_40);
        Serializer::addZeros((Serializer *)local_90,2);
        Serializer::addZeros((Serializer *)local_90,3);
        Serializer::get160<jbcoin::detail::CurrencyTag>((Serializer *)local_90,currency,0);
        Serializer::~Serializer((Serializer *)local_90);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        return true;
      }
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 0x28) {
        bVar1 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHex(currency,code,false);
        return bVar1;
      }
      return false;
    }
  }
  base_uint<160UL,_jbcoin::detail::CurrencyTag>::operator=(currency);
  return true;
}

Assistant:

bool to_currency(Currency& currency, std::string const& code)
{
    if (code.empty () || !code.compare (systemCurrencyCode()))
    {
        currency = zero;
        return true;
    }

    static const int CURRENCY_CODE_LENGTH = 3;
    if (code.size () == CURRENCY_CODE_LENGTH)
    {
        Blob codeBlob (CURRENCY_CODE_LENGTH);

        std::transform (code.begin (), code.end (), codeBlob.begin (), ::toupper);

        Serializer  s;

        s.addZeros (96 / 8);
        s.addRaw (codeBlob);
        s.addZeros (16 / 8);
        s.addZeros (24 / 8);

        s.get160 (currency, 0);
        return true;
    }

    if (40 == code.size ())
        return currency.SetHex (code);

    return false;
}